

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<duckdb::string_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  data_ptr_t pdVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  Vector *pVVar5;
  idx_t iVar6;
  reference q_00;
  undefined8 uVar7;
  unsigned_long *q;
  _func_int **pp_Var8;
  uint64_t uVar9;
  idx_t iVar10;
  idx_t n;
  RESULT_TYPE RVar11;
  string_t sVar12;
  Interpolator<true> interp;
  QuantileDirect<duckdb::string_t> local_89;
  FunctionData *local_88;
  list_entry_t *local_80;
  AggregateFinalizeData *local_78;
  vector<duckdb::QuantileValue,_true> *local_70;
  pointer local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    local_78 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar6);
    pdVar2 = pVVar5->data;
    local_68 = (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
               super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    target->offset = iVar6;
    pp_Var8 = pFVar1[4]._vptr_FunctionData;
    pp_Var3 = pFVar1[5]._vptr_FunctionData;
    local_88 = pFVar1;
    local_80 = target;
    local_60 = pVVar5;
    if (pp_Var8 != pp_Var3) {
      local_70 = (vector<duckdb::QuantileValue,_true> *)(pFVar1 + 1);
      iVar10 = 0;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_70,(size_type)*pp_Var8);
        n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
        local_58.desc = *(bool *)&local_88[7]._vptr_FunctionData;
        uVar7 = CONCAT71((int7)((ulong)local_88 >> 8),local_58.desc);
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar10;
        local_58.end = n;
        RVar11 = Interpolator<true>::
                 InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                           (&local_58,local_68,&local_89);
        sVar12.value._0_8_ = RVar11.value._8_8_;
        sVar12.value.pointer.ptr = (char *)uVar7;
        sVar12 = StringVector::AddStringOrBlob((StringVector *)local_60,RVar11.value._0_8_,sVar12);
        p_Var4 = *pp_Var8;
        *(long *)(pdVar2 + (long)p_Var4 * 0x10 + iVar6 * 0x10) = sVar12.value._0_8_;
        *(long *)(pdVar2 + (long)p_Var4 * 0x10 + iVar6 * 0x10 + 8) = sVar12.value._8_8_;
        pp_Var8 = pp_Var8 + 1;
        iVar10 = local_58.FRN;
      } while (pp_Var8 != pp_Var3);
    }
    uVar9 = ((long)local_88[2]._vptr_FunctionData - (long)local_88[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    local_80->length = uVar9;
    ListVector::SetListSize(local_78->result,uVar9 + local_80->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}